

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# json_object.c
# Opt level: O3

json_object * json_object_new_double(double d)

{
  json_object *pjVar1;
  
  pjVar1 = (json_object *)malloc(0x30);
  if (pjVar1 != (json_object *)0x0) {
    pjVar1->o_type = json_type_double;
    pjVar1->_ref_count = 1;
    pjVar1->_pb = (printbuf *)0x0;
    pjVar1->_user_delete = (json_object_delete_fn *)0x0;
    pjVar1->_userdata = (void *)0x0;
    pjVar1->_to_json_string = json_object_double_to_json_string_default;
    *(double *)(pjVar1 + 1) = d;
  }
  return pjVar1;
}

Assistant:

struct json_object *json_object_new_double(double d)
{
	struct json_object_double *jso = JSON_OBJECT_NEW(double);
	if (!jso)
		return NULL;
	jso->base._to_json_string = &json_object_double_to_json_string_default;
	jso->c_double = d;
	return &jso->base;
}